

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int INT_EVsubmit_or_wait
              (EVsource source,void *data,attr_list attrs,EVSubmitCallbackFunc cb,void *user_data)

{
  stone_type attrs_00;
  undefined8 in_RCX;
  EVstone s;
  CManager_conflict in_RDX;
  undefined8 *in_RDI;
  EVsource in_R8;
  stone_type stone;
  CManager_conflict cm;
  event_path_data in_stack_ffffffffffffffb8;
  void *data_00;
  int local_4;
  
  s = (EVstone)((ulong)in_RCX >> 0x20);
  data_00 = (void *)*in_RDI;
  attrs_00 = stone_struct(in_stack_ffffffffffffffb8,0);
  if (attrs_00 == (stone_type)0x0) {
    local_4 = -1;
  }
  else if (attrs_00->is_stalled == 0) {
    INT_EVsubmit(in_R8,data_00,(attr_list)attrs_00);
    local_4 = 1;
  }
  else {
    register_backpressure_callback(in_RDX,s,(EVSubmitCallbackFunc)in_R8,data_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
INT_EVsubmit_or_wait(EVsource source, void *data, attr_list attrs,
                    EVSubmitCallbackFunc cb, void *user_data) {
    CManager cm = source->cm;
    stone_type stone;

    stone = stone_struct(cm->evp, source->local_stone_id);
    if (!stone) return -1;

    if (stone->is_stalled) {
        register_backpressure_callback(source->cm, source->local_stone_id, cb, user_data);
        return 0;
    } else {
        INT_EVsubmit(source, data, attrs);
        return 1;
    }
}